

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  Slice *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ParsedInternalKey *in_RDI;
  long in_FS_OFFSET;
  Saver *s;
  ParsedInternalKey parsed_key;
  ParsedInternalKey *in_stack_ffffffffffffffa8;
  Slice *this;
  undefined1 local_28 [24];
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ParsedInternalKey::ParsedInternalKey(in_stack_ffffffffffffffa8);
  bVar2 = ParseInternalKey(in_RDX,in_RDI);
  if (bVar2) {
    plVar1 = (long *)(in_RDI->user_key).size_;
    iVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_28,&in_RDI->sequence);
    if (iVar3 == 0) {
      uVar4 = 2;
      if (local_10 == 1) {
        uVar4 = 1;
      }
      *(undefined4 *)&(in_RDI->user_key).data_ = uVar4;
      if (*(int *)&(in_RDI->user_key).data_ == 1) {
        this = (Slice *)in_RDI[1].user_key.data_;
        Slice::data(this);
        Slice::size(this);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (in_RSI,(char *)in_RDX,(size_type)in_RDI);
      }
    }
  }
  else {
    *(undefined4 *)&(in_RDI->user_key).data_ = 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}